

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

natwm_error client_unset_fullscreen(natwm_state *state,client *client)

{
  client_state cVar1;
  theme *ptVar2;
  border_theme *pbVar3;
  uint16_t previous_border_width;
  
  if (client->is_fullscreen == false) {
    ptVar2 = state->workspace_list->theme;
    cVar1 = client->state;
    if ((cVar1 & CLIENT_URGENT) == 0) {
      if ((cVar1 & CLIENT_STICKY) == 0) {
        if ((cVar1 & CLIENT_OFF_SCREEN) == 0) {
          pbVar3 = (border_theme *)
                   ((long)&ptVar2->border_width->unfocused + (ulong)((uint)client->is_focused * 2));
        }
        else {
          pbVar3 = ptVar2->border_width;
        }
      }
      else {
        pbVar3 = (border_theme *)&ptVar2->border_width->sticky;
      }
    }
    else {
      pbVar3 = (border_theme *)&ptVar2->border_width->urgent;
    }
    previous_border_width = pbVar3->unfocused;
  }
  else {
    previous_border_width = 0;
  }
  client->is_fullscreen = false;
  ewmh_remove_window_state(state,client->window);
  client_configure_window_rect(state->xcb,client->window,client->rect,(uint)previous_border_width);
  update_theme(state,client,previous_border_width);
  return NO_ERROR;
}

Assistant:

enum natwm_error client_unset_fullscreen(const struct natwm_state *state, struct client *client)
{
        struct theme *theme = state->workspace_list->theme;
        uint16_t border_width = client_get_active_border_width(theme, client);

        client->is_fullscreen = false;

        ewmh_remove_window_state(state, client->window);

        client_configure_window_rect(state->xcb, client->window, client->rect, border_width);

        update_theme(state, client, border_width);

        return NO_ERROR;
}